

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void __thiscall
HTTPPathHandler::HTTPPathHandler
          (HTTPPathHandler *this,string _prefix,bool _exactMatch,HTTPRequestHandler _handler)

{
  long lVar1;
  long lVar2;
  function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RCX;
  bool in_DL;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  lVar2 = *(long *)CONCAT71(in_register_00000031,_exactMatch);
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,lVar2,((long *)CONCAT71(in_register_00000031,_exactMatch))[1] + lVar2);
  this->exactMatch = in_DL;
  std::
  function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->handler,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HTTPPathHandler(std::string _prefix, bool _exactMatch, HTTPRequestHandler _handler):
        prefix(_prefix), exactMatch(_exactMatch), handler(_handler)
    {
    }